

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O1

void __thiscall
density::
sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
::~sp_heter_queue(sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  *this)

{
  bool bVar1;
  Consume consume;
  Consume local_28;
  
  clear(this);
  local_28.m_queue =
       (LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
        *)0x0;
  local_28.m_control = (ControlBlock *)0x0;
  local_28.m_next_ptr = 0;
  detail::
  LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  ::Consume::begin_iteration
            (&local_28,
             (LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
              *)this);
  bVar1 = detail::
          LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::empty(&local_28);
  if (!bVar1) {
    detail::
    LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
    ::Consume::clean_dead_elements(&local_28);
  }
  if (local_28.m_control != (ControlBlock *)0x0) {
    detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::unpin_page
              (local_28.m_control);
  }
  detail::
  LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::~LFQueue_Tail((LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *)this);
  return;
}

Assistant:

~sp_heter_queue()
        {
            clear();

            Consume consume;
            consume.begin_iteration(this);
            if (!consume.empty())
            {
                consume.clean_dead_elements();
            }
        }